

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall
pass_remove_empty_block_always_Test::~pass_remove_empty_block_always_Test
          (pass_remove_empty_block_always_Test *this)

{
  pass_remove_empty_block_always_Test *this_local;
  
  ~pass_remove_empty_block_always_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, remove_empty_block_always) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    mod.sequential();
    remove_empty_block(&mod);
    EXPECT_EQ(mod.stmts_count(), 0);
}